

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O2

void duckdb::ListHasAnyFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  list_entry_t *plVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  anon_class_40_5_f9ad11e0 fun;
  anon_class_40_5_f9ad11e0 fun_00;
  anon_class_40_5_f9ad11e0 fun_01;
  anon_class_40_5_f9ad11e0 fun_02;
  anon_class_40_5_f9ad11e0 fun_03;
  anon_class_40_5_f9ad11e0 fun_04;
  anon_class_40_5_f9ad11e0 fun_05;
  anon_class_40_5_f9ad11e0 fun_06;
  anon_class_40_5_f9ad11e0 fun_07;
  anon_class_40_5_f9ad11e0 fun_08;
  anon_class_40_5_f9ad11e0 fun_09;
  anon_class_40_5_f9ad11e0 fun_10;
  bool bVar8;
  reference vec;
  reference vec_00;
  LogicalType *pLVar9;
  idx_t iVar10;
  idx_t iVar11;
  Vector *this;
  Vector *this_00;
  idx_t iVar12;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  idx_t i;
  uint64_t *puVar16;
  ValidityMask *this_01;
  ulong uVar17;
  ValidityMask *in_R8;
  idx_t in_R9;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  idx_t i_2;
  ulong uVar22;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t left_06;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t right_06;
  LogicalType local_298;
  LogicalType local_280;
  string_t *r_sortkey_ptr;
  string_t *l_sortkey_ptr;
  UnifiedVectorFormat local_258;
  UnifiedVectorFormat ldata;
  Vector r_sortkey_vec;
  Vector l_sortkey_vec;
  string_set_t set;
  UnifiedVectorFormat r_child_format;
  UnifiedVectorFormat l_child_format;
  
  vec = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vec_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  pLVar9 = ListType::GetChildType(&vec->type);
  LogicalType::LogicalType((LogicalType *)&l_sortkey_vec,SQLNULL);
  bVar8 = LogicalType::operator==(pLVar9,(LogicalType *)&l_sortkey_vec);
  if (bVar8) {
    LogicalType::~LogicalType((LogicalType *)&l_sortkey_vec);
LAB_01e11a14:
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    *result->data = '\0';
    return;
  }
  pLVar9 = ListType::GetChildType(&vec_00->type);
  LogicalType::LogicalType((LogicalType *)&r_sortkey_vec,SQLNULL);
  bVar8 = LogicalType::operator==(pLVar9,(LogicalType *)&r_sortkey_vec);
  LogicalType::~LogicalType((LogicalType *)&r_sortkey_vec);
  LogicalType::~LogicalType((LogicalType *)&l_sortkey_vec);
  if (bVar8) goto LAB_01e11a14;
  iVar10 = ListVector::GetListSize(vec);
  iVar11 = ListVector::GetListSize(vec_00);
  this = ListVector::GetEntry(vec);
  this_00 = ListVector::GetEntry(vec_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&l_child_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&r_child_format);
  Vector::ToUnifiedFormat(this,iVar10,&l_child_format);
  Vector::ToUnifiedFormat(this_00,iVar11,&r_child_format);
  LogicalType::LogicalType(&local_280,BLOB);
  Vector::Vector(&l_sortkey_vec,&local_280,iVar10);
  LogicalType::~LogicalType(&local_280);
  LogicalType::LogicalType(&local_298,BLOB);
  Vector::Vector(&r_sortkey_vec,&local_298,iVar11);
  LogicalType::~LogicalType(&local_298);
  CreateSortKeyHelpers::CreateSortKey(this,iVar10,(OrderModifiers)0x302,&l_sortkey_vec);
  CreateSortKeyHelpers::CreateSortKey(this_00,iVar11,(OrderModifiers)0x302,&r_sortkey_vec);
  l_sortkey_ptr = (string_t *)l_sortkey_vec.data;
  r_sortkey_ptr = (string_t *)r_sortkey_vec.data;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar10 = args->count;
  VVar1 = vec->vector_type;
  VVar2 = vec_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar4 = result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      fun.r_sortkey_ptr = &r_sortkey_ptr;
      fun.l_sortkey_ptr = &l_sortkey_ptr;
      fun.l_child_format = &l_child_format;
      fun.r_child_format = &r_child_format;
      fun.set = &set;
      bVar8 = BinaryLambdaWrapper::
              Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                        (fun,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,in_R8,in_R9);
      *pdVar4 = bVar8;
      goto LAB_01e11e3d;
    }
  }
  else {
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar4 = vec->data;
      plVar5 = (list_entry_t *)vec_00->data;
      puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        FlatVector::SetValidity(result,&vec->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          puVar16 = (uint64_t *)(pdVar4 + 8);
          for (iVar11 = 0; iVar10 != iVar11; iVar11 = iVar11 + 1) {
            fun_05.r_sortkey_ptr = &r_sortkey_ptr;
            fun_05.l_sortkey_ptr = &l_sortkey_ptr;
            fun_05.l_child_format = &l_child_format;
            fun_05.r_child_format = &r_child_format;
            fun_05.set = &set;
            left_02.length = *puVar16;
            left_02.offset = puVar16[-1];
            bVar8 = BinaryLambdaWrapper::
                    Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                              (fun_05,left_02,*plVar5,in_R8,in_R9);
            pdVar6[iVar11] = bVar8;
            puVar16 = puVar16 + 2;
          }
        }
        else {
          uVar15 = 0;
          for (uVar13 = 0; uVar13 != iVar10 + 0x3f >> 6; uVar13 = uVar13 + 1) {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar18 = uVar15 + 0x40;
              if (iVar10 <= uVar15 + 0x40) {
                uVar18 = iVar10;
              }
LAB_01e11d8b:
              puVar16 = (uint64_t *)(pdVar4 + uVar15 * 0x10 + 8);
              for (uVar20 = uVar15; uVar20 < uVar18; uVar20 = uVar20 + 1) {
                fun_01.r_sortkey_ptr = &r_sortkey_ptr;
                fun_01.l_sortkey_ptr = &l_sortkey_ptr;
                fun_01.l_child_format = &l_child_format;
                fun_01.r_child_format = &r_child_format;
                fun_01.set = &set;
                left_00.length = *puVar16;
                left_00.offset = puVar16[-1];
                bVar8 = BinaryLambdaWrapper::
                        Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                  (fun_01,left_00,*plVar5,in_R8,in_R9);
                pdVar6[uVar20] = bVar8;
                puVar16 = puVar16 + 2;
              }
            }
            else {
              uVar19 = puVar3[uVar13];
              uVar18 = uVar15 + 0x40;
              if (iVar10 <= uVar15 + 0x40) {
                uVar18 = iVar10;
              }
              if (uVar19 == 0xffffffffffffffff) goto LAB_01e11d8b;
              uVar20 = uVar18;
              if (uVar19 != 0) {
                puVar16 = (uint64_t *)(pdVar4 + uVar15 * 0x10 + 8);
                uVar22 = 0;
                for (uVar20 = uVar15; uVar20 < uVar18; uVar20 = uVar20 + 1) {
                  if ((uVar19 >> (uVar22 & 0x3f) & 1) != 0) {
                    fun_00.r_sortkey_ptr = &r_sortkey_ptr;
                    fun_00.l_sortkey_ptr = &l_sortkey_ptr;
                    fun_00.l_child_format = &l_child_format;
                    fun_00.r_child_format = &r_child_format;
                    fun_00.set = &set;
                    left.length = *puVar16;
                    left.offset = puVar16[-1];
                    bVar8 = BinaryLambdaWrapper::
                            Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                      (fun_00,left,*plVar5,in_R8,in_R9);
                    pdVar6[uVar20] = bVar8;
                  }
                  puVar16 = puVar16 + 2;
                  uVar22 = uVar22 + 1;
                }
              }
            }
            uVar15 = uVar20;
          }
        }
        goto LAB_01e11e3d;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar4 = vec->data;
          pdVar6 = vec_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar7 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vec);
          FlatVector::SetValidity(result,&vec->validity);
          FlatVector::VerifyFlatVector(vec_00);
          this_01 = &result->validity;
          ValidityMask::Combine(this_01,&vec_00->validity,iVar10);
          if ((this_01->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            lVar21 = 8;
            for (iVar11 = 0; iVar10 != iVar11; iVar11 = iVar11 + 1) {
              fun_10.r_sortkey_ptr = &r_sortkey_ptr;
              fun_10.l_sortkey_ptr = &l_sortkey_ptr;
              fun_10.l_child_format = &l_child_format;
              fun_10.r_child_format = &r_child_format;
              fun_10.set = &set;
              left_06.length = *(uint64_t *)(pdVar4 + lVar21);
              left_06.offset = *(uint64_t *)(pdVar4 + lVar21 + -8);
              right_06.length = *(uint64_t *)(pdVar6 + lVar21);
              right_06.offset = *(uint64_t *)(pdVar6 + lVar21 + -8);
              bVar8 = BinaryLambdaWrapper::
                      Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                (fun_10,left_06,right_06,in_R8,in_R9);
              pdVar7[iVar11] = bVar8;
              lVar21 = lVar21 + 0x10;
            }
          }
          else {
            uVar13 = 0;
            for (uVar15 = 0; uVar15 != iVar10 + 0x3f >> 6; uVar15 = uVar15 + 1) {
              puVar3 = (this_01->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar18 = uVar13 + 0x40;
                if (iVar10 <= uVar13 + 0x40) {
                  uVar18 = iVar10;
                }
LAB_01e122ce:
                uVar19 = uVar13 << 4 | 8;
                for (; uVar20 = uVar13, uVar13 < uVar18; uVar13 = uVar13 + 1) {
                  fun_07.r_sortkey_ptr = &r_sortkey_ptr;
                  fun_07.l_sortkey_ptr = &l_sortkey_ptr;
                  fun_07.l_child_format = &l_child_format;
                  fun_07.r_child_format = &r_child_format;
                  fun_07.set = &set;
                  left_04.length = *(uint64_t *)(pdVar4 + uVar19);
                  left_04.offset = *(uint64_t *)(pdVar4 + (uVar19 - 8));
                  right_03.length = *(uint64_t *)(pdVar6 + uVar19);
                  right_03.offset = *(uint64_t *)(pdVar6 + (uVar19 - 8));
                  bVar8 = BinaryLambdaWrapper::
                          Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                    (fun_07,left_04,right_03,in_R8,in_R9);
                  pdVar7[uVar13] = bVar8;
                  uVar19 = uVar19 + 0x10;
                }
              }
              else {
                uVar19 = puVar3[uVar15];
                uVar18 = uVar13 + 0x40;
                if (iVar10 <= uVar13 + 0x40) {
                  uVar18 = iVar10;
                }
                if (uVar19 == 0xffffffffffffffff) goto LAB_01e122ce;
                uVar20 = uVar18;
                if (uVar19 != 0) {
                  uVar17 = uVar13 << 4 | 8;
                  uVar22 = 0;
                  for (; uVar20 = uVar13, uVar13 < uVar18; uVar13 = uVar13 + 1) {
                    if ((uVar19 >> (uVar22 & 0x3f) & 1) != 0) {
                      fun_06.r_sortkey_ptr = &r_sortkey_ptr;
                      fun_06.l_sortkey_ptr = &l_sortkey_ptr;
                      fun_06.l_child_format = &l_child_format;
                      fun_06.r_child_format = &r_child_format;
                      fun_06.set = &set;
                      left_03.length = *(uint64_t *)(pdVar4 + uVar17);
                      left_03.offset = *(uint64_t *)(pdVar4 + (uVar17 - 8));
                      right_02.length = *(uint64_t *)(pdVar6 + uVar17);
                      right_02.offset = *(uint64_t *)(pdVar6 + (uVar17 - 8));
                      bVar8 = BinaryLambdaWrapper::
                              Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                        (fun_06,left_03,right_02,in_R8,in_R9);
                      pdVar7[uVar13] = bVar8;
                    }
                    uVar17 = uVar17 + 0x10;
                    uVar22 = uVar22 + 1;
                  }
                }
              }
              uVar13 = uVar20;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_258);
          Vector::ToUnifiedFormat(vec,iVar10,&ldata);
          Vector::ToUnifiedFormat(vec_00,iVar10,&local_258);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar4 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_258.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            for (iVar11 = 0; iVar10 != iVar11; iVar11 = iVar11 + 1) {
              iVar12 = iVar11;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar12 = (idx_t)(ldata.sel)->sel_vector[iVar11];
              }
              iVar14 = iVar11;
              if ((local_258.sel)->sel_vector != (sel_t *)0x0) {
                iVar14 = (idx_t)(local_258.sel)->sel_vector[iVar11];
              }
              fun_02.r_sortkey_ptr = &r_sortkey_ptr;
              fun_02.l_sortkey_ptr = &l_sortkey_ptr;
              fun_02.l_child_format = &l_child_format;
              fun_02.r_child_format = &r_child_format;
              fun_02.set = &set;
              left_01.length = *(uint64_t *)(ldata.data + iVar12 * 0x10 + 8);
              left_01.offset = *(uint64_t *)(ldata.data + iVar12 * 0x10);
              right.length = *(uint64_t *)(local_258.data + iVar14 * 0x10 + 8);
              right.offset = *(uint64_t *)(local_258.data + iVar14 * 0x10);
              bVar8 = BinaryLambdaWrapper::
                      Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                (fun_02,left_01,right,in_R8,in_R9);
              pdVar4[iVar11] = bVar8;
            }
          }
          else {
            for (iVar11 = 0; iVar10 != iVar11; iVar11 = iVar11 + 1) {
              iVar12 = iVar11;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar12 = (idx_t)(ldata.sel)->sel_vector[iVar11];
              }
              iVar14 = iVar11;
              if ((local_258.sel)->sel_vector != (sel_t *)0x0) {
                iVar14 = (idx_t)(local_258.sel)->sel_vector[iVar11];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar12 >> 6] >> (iVar12 & 0x3f) & 1) != 0)) &&
                 ((local_258.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_258.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0)))) {
                fun_08.r_sortkey_ptr = &r_sortkey_ptr;
                fun_08.l_sortkey_ptr = &l_sortkey_ptr;
                fun_08.l_child_format = &l_child_format;
                fun_08.r_child_format = &r_child_format;
                fun_08.set = &set;
                left_05.length = *(uint64_t *)(ldata.data + iVar12 * 0x10 + 8);
                left_05.offset = *(uint64_t *)(ldata.data + iVar12 * 0x10);
                right_04.length = *(uint64_t *)(local_258.data + iVar14 * 0x10 + 8);
                right_04.offset = *(uint64_t *)(local_258.data + iVar14 * 0x10);
                bVar8 = BinaryLambdaWrapper::
                        Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                  (fun_08,left_05,right_04,in_R8,in_R9);
                pdVar4[iVar11] = bVar8;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_258);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        goto LAB_01e11e3d;
      }
      plVar5 = (list_entry_t *)vec->data;
      puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = vec_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        FlatVector::SetValidity(result,&vec_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          puVar16 = (uint64_t *)(pdVar4 + 8);
          for (iVar11 = 0; iVar10 != iVar11; iVar11 = iVar11 + 1) {
            fun_09.r_sortkey_ptr = &r_sortkey_ptr;
            fun_09.l_sortkey_ptr = &l_sortkey_ptr;
            fun_09.l_child_format = &l_child_format;
            fun_09.r_child_format = &r_child_format;
            fun_09.set = &set;
            right_05.length = *puVar16;
            right_05.offset = puVar16[-1];
            bVar8 = BinaryLambdaWrapper::
                    Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                              (fun_09,*plVar5,right_05,in_R8,in_R9);
            pdVar6[iVar11] = bVar8;
            puVar16 = puVar16 + 2;
          }
        }
        else {
          uVar13 = 0;
          for (uVar15 = 0; uVar15 != iVar10 + 0x3f >> 6; uVar15 = uVar15 + 1) {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar18 = uVar13 + 0x40;
              if (iVar10 <= uVar13 + 0x40) {
                uVar18 = iVar10;
              }
LAB_01e120a8:
              puVar16 = (uint64_t *)(pdVar4 + uVar13 * 0x10 + 8);
              for (; uVar20 = uVar13, uVar13 < uVar18; uVar13 = uVar13 + 1) {
                fun_04.r_sortkey_ptr = &r_sortkey_ptr;
                fun_04.l_sortkey_ptr = &l_sortkey_ptr;
                fun_04.l_child_format = &l_child_format;
                fun_04.r_child_format = &r_child_format;
                fun_04.set = &set;
                right_01.length = *puVar16;
                right_01.offset = puVar16[-1];
                bVar8 = BinaryLambdaWrapper::
                        Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                  (fun_04,*plVar5,right_01,in_R8,in_R9);
                pdVar6[uVar13] = bVar8;
                puVar16 = puVar16 + 2;
              }
            }
            else {
              uVar19 = puVar3[uVar15];
              uVar18 = uVar13 + 0x40;
              if (iVar10 <= uVar13 + 0x40) {
                uVar18 = iVar10;
              }
              if (uVar19 == 0xffffffffffffffff) goto LAB_01e120a8;
              uVar20 = uVar18;
              if (uVar19 != 0) {
                puVar16 = (uint64_t *)(pdVar4 + uVar13 * 0x10 + 8);
                uVar22 = 0;
                for (; uVar20 = uVar13, uVar13 < uVar18; uVar13 = uVar13 + 1) {
                  if ((uVar19 >> (uVar22 & 0x3f) & 1) != 0) {
                    fun_03.r_sortkey_ptr = &r_sortkey_ptr;
                    fun_03.l_sortkey_ptr = &l_sortkey_ptr;
                    fun_03.l_child_format = &l_child_format;
                    fun_03.r_child_format = &r_child_format;
                    fun_03.set = &set;
                    right_00.length = *puVar16;
                    right_00.offset = puVar16[-1];
                    bVar8 = BinaryLambdaWrapper::
                            Operation<duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,duckdb::list_entry_t,bool>
                                      (fun_03,*plVar5,right_00,in_R8,in_R9);
                    pdVar6[uVar13] = bVar8;
                  }
                  puVar16 = puVar16 + 2;
                  uVar22 = uVar22 + 1;
                }
              }
            }
            uVar13 = uVar20;
          }
        }
        goto LAB_01e11e3d;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01e11e3d:
  ::std::
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  Vector::~Vector(&r_sortkey_vec);
  Vector::~Vector(&l_sortkey_vec);
  UnifiedVectorFormat::~UnifiedVectorFormat(&r_child_format);
  UnifiedVectorFormat::~UnifiedVectorFormat(&l_child_format);
  return;
}

Assistant:

static void ListHasAnyFunction(DataChunk &args, ExpressionState &, Vector &result) {

	auto &l_vec = args.data[0];
	auto &r_vec = args.data[1];

	if (ListType::GetChildType(l_vec.GetType()) == LogicalType::SQLNULL ||
	    ListType::GetChildType(r_vec.GetType()) == LogicalType::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<bool>(result)[0] = false;
		return;
	}

	const auto l_size = ListVector::GetListSize(l_vec);
	const auto r_size = ListVector::GetListSize(r_vec);

	auto &l_child = ListVector::GetEntry(l_vec);
	auto &r_child = ListVector::GetEntry(r_vec);

	// Setup unified formats for the list elements
	UnifiedVectorFormat l_child_format;
	UnifiedVectorFormat r_child_format;

	l_child.ToUnifiedFormat(l_size, l_child_format);
	r_child.ToUnifiedFormat(r_size, r_child_format);

	// Create the sort keys for the list elements
	Vector l_sortkey_vec(LogicalType::BLOB, l_size);
	Vector r_sortkey_vec(LogicalType::BLOB, r_size);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);

	CreateSortKeyHelpers::CreateSortKey(l_child, l_size, order_modifiers, l_sortkey_vec);
	CreateSortKeyHelpers::CreateSortKey(r_child, r_size, order_modifiers, r_sortkey_vec);

	const auto l_sortkey_ptr = FlatVector::GetData<string_t>(l_sortkey_vec);
	const auto r_sortkey_ptr = FlatVector::GetData<string_t>(r_sortkey_vec);

	string_set_t set;

	BinaryExecutor::Execute<list_entry_t, list_entry_t, bool>(
	    l_vec, r_vec, result, args.size(), [&](const list_entry_t &l_list, const list_entry_t &r_list) {
		    // Short circuit if either list is empty
		    if (l_list.length == 0 || r_list.length == 0) {
			    return false;
		    }

		    auto build_list = l_list;
		    auto probe_list = r_list;

		    auto build_data = l_sortkey_ptr;
		    auto probe_data = r_sortkey_ptr;

		    auto build_format = &l_child_format;
		    auto probe_format = &r_child_format;

		    // Use the smaller list to build the set
		    if (r_list.length < l_list.length) {

			    build_list = r_list;
			    probe_list = l_list;

			    build_data = r_sortkey_ptr;
			    probe_data = l_sortkey_ptr;

			    build_format = &r_child_format;
			    probe_format = &l_child_format;
		    }

		    // Reset the set
		    set.clear();

		    // Build the set
		    for (auto idx = build_list.offset; idx < build_list.offset + build_list.length; idx++) {
			    const auto entry_idx = build_format->sel->get_index(idx);
			    if (build_format->validity.RowIsValid(entry_idx)) {
				    set.insert(build_data[entry_idx]);
			    }
		    }
		    // Probe the set
		    for (auto idx = probe_list.offset; idx < probe_list.offset + probe_list.length; idx++) {
			    const auto entry_idx = probe_format->sel->get_index(idx);
			    if (probe_format->validity.RowIsValid(entry_idx) && set.find(probe_data[entry_idx]) != set.end()) {
				    return true;
			    }
		    }
		    return false;
	    });
}